

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HeapBucket.cpp
# Opt level: O2

size_t __thiscall
Memory::HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>::
GetEmptyHeapBlockCount
          (HeapBucketT<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>_>
           *this)

{
  code *pcVar1;
  bool bVar2;
  size_t sVar3;
  undefined4 *puVar4;
  
  sVar3 = HeapBlockList::
          Count<Memory::SmallNormalWithBarrierHeapBlockT<SmallAllocationBlockAttributes>>
                    (this->emptyBlockList);
  if (sVar3 != (this->super_HeapBucket).emptyHeapBlockCount) {
    AssertCount = AssertCount + 1;
    Js::Throw::LogAssert();
    puVar4 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
    *puVar4 = 1;
    bVar2 = Js::Throw::ReportAssert
                      ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Common/Memory/HeapBucket.cpp"
                       ,0x1d6,"(count == this->emptyHeapBlockCount)",
                       "count == this->emptyHeapBlockCount");
    if (!bVar2) {
      pcVar1 = (code *)invalidInstructionException();
      (*pcVar1)();
    }
    *puVar4 = 0;
  }
  return sVar3;
}

Assistant:

size_t
HeapBucketT<TBlockType>::GetEmptyHeapBlockCount() const
{
    size_t count = HeapBlockList::Count(this->emptyBlockList);
    RECYCLER_SLOW_CHECK(Assert(count == this->emptyHeapBlockCount));
    return count;
}